

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpath.cpp
# Opt level: O2

float __thiscall VPath::VPathData::length(VPathData *this)

{
  Element EVar1;
  pointer pEVar2;
  pointer pVVar3;
  long lVar4;
  pointer pEVar5;
  float fVar6;
  VPointF local_48;
  VPointF VStack_40;
  
  if (this->mLengthDirty == false) {
    fVar6 = this->mLength;
  }
  else {
    this->mLengthDirty = false;
    this->mLength = 0.0;
    pEVar2 = (this->m_elements).super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    fVar6 = 0.0;
    lVar4 = 0;
    for (pEVar5 = (this->m_elements).
                  super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
                  super__Vector_impl_data._M_start; pEVar5 != pEVar2; pEVar5 = pEVar5 + 1) {
      EVar1 = *pEVar5;
      if (EVar1 == CubicTo) {
        pVVar3 = (this->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                 super__Vector_impl_data._M_start;
        VBezier::fromPoints(pVVar3 + lVar4 + -1,pVVar3 + lVar4,pVVar3 + lVar4 + 1,pVVar3 + lVar4 + 2
                           );
        fVar6 = VBezier::length((VBezier *)&local_48);
        fVar6 = fVar6 + this->mLength;
        this->mLength = fVar6;
        lVar4 = lVar4 + 3;
      }
      else {
        if (EVar1 == LineTo) {
          pVVar3 = (this->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar4 + -1;
          local_48 = *pVVar3;
          VStack_40 = pVVar3[1];
          fVar6 = VLine::length((VLine *)&local_48);
          fVar6 = fVar6 + this->mLength;
          this->mLength = fVar6;
        }
        else if (EVar1 != MoveTo) goto LAB_00110ca9;
        lVar4 = lVar4 + 1;
      }
LAB_00110ca9:
    }
  }
  return fVar6;
}

Assistant:

float VPath::VPathData::length() const
{
    if (!mLengthDirty) return mLength;

    mLengthDirty = false;
    mLength = 0.0;

    size_t i = 0;
    for (auto e : m_elements) {
        switch (e) {
        case VPath::Element::MoveTo:
            i++;
            break;
        case VPath::Element::LineTo: {
            mLength += VLine(m_points[i - 1], m_points[i]).length();
            i++;
            break;
        }
        case VPath::Element::CubicTo: {
            mLength += VBezier::fromPoints(m_points[i - 1], m_points[i],
                                           m_points[i + 1], m_points[i + 2])
                           .length();
            i += 3;
            break;
        }
        case VPath::Element::Close:
            break;
        }
    }

    return mLength;
}